

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O3

void reportLpDimensions(HighsLogOptions *log_options,HighsLp *lp)

{
  pointer pHVar1;
  long lVar2;
  char *format;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  if ((long)lp->num_col_ == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lp->num_col_];
  }
  highsLogUser(log_options,kInfo,"LP has %d columns, %d rows");
  pHVar1 = (lp->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (((lp->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
       super__Vector_impl_data._M_finish != pHVar1) && (0 < (long)lp->num_col_)) {
    lVar2 = 0;
    uVar5 = 0;
    do {
      uVar4 = (int)uVar5 + (uint)(pHVar1[lVar2] == kInteger);
      uVar5 = (ulong)uVar4;
      lVar2 = lVar2 + 1;
    } while (lp->num_col_ != lVar2);
    if (uVar4 != 0) {
      format = ", %d nonzeros and %d integer columns\n";
      goto LAB_002422c5;
    }
  }
  format = " and %d nonzeros\n";
  uVar5 = 0;
LAB_002422c5:
  highsLogUser(log_options,kInfo,format,(ulong)uVar3,uVar5);
  return;
}

Assistant:

void reportLpDimensions(const HighsLogOptions& log_options, const HighsLp& lp) {
  HighsInt lp_num_nz;
  if (lp.num_col_ == 0)
    lp_num_nz = 0;
  else
    lp_num_nz = lp.a_matrix_.start_[lp.num_col_];
  highsLogUser(log_options, HighsLogType::kInfo,
               "LP has %" HIGHSINT_FORMAT " columns, %" HIGHSINT_FORMAT " rows",
               lp.num_col_, lp.num_row_);
  HighsInt num_int = getNumInt(lp);
  if (num_int) {
    highsLogUser(log_options, HighsLogType::kInfo,
                 ", %" HIGHSINT_FORMAT " nonzeros and %" HIGHSINT_FORMAT
                 " integer columns\n",
                 lp_num_nz, num_int);
  } else {
    highsLogUser(log_options, HighsLogType::kInfo,
                 " and %" HIGHSINT_FORMAT " nonzeros\n", lp_num_nz, num_int);
  }
}